

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

LR des_FP(LR lr)

{
  uint uVar1;
  LR LVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = lr.L;
  uVar1 = lr.R << 1 | (uint)((long)lr < 0);
  uVar3 = (uVar4 & 0x7fffffff ^ uVar1) & 0x55555555;
  uVar4 = uVar3 * 2 ^ (uVar4 << 1 | (uint)((int)uVar4 < 0));
  uVar3 = uVar3 ^ uVar1;
  uVar1 = (uVar3 >> 8 ^ uVar4) & 0xff00ff;
  uVar3 = uVar1 << 8 ^ uVar3;
  uVar1 = uVar1 ^ uVar4;
  uVar4 = (uVar3 >> 2 ^ uVar1) & 0x33333333;
  uVar3 = uVar4 * 4 ^ uVar3;
  uVar4 = uVar4 ^ uVar1;
  uVar5 = uVar3 & 0xffff ^ uVar4 >> 0x10;
  uVar4 = uVar5 << 0x10 ^ uVar4;
  uVar5 = uVar5 ^ uVar3;
  uVar1 = (uVar4 >> 4 ^ uVar5) & 0xf0f0f0f;
  LVar2.L = uVar1 << 4 ^ uVar4;
  LVar2.R = uVar1 ^ uVar5;
  return LVar2;
}

Assistant:

static inline LR des_FP(LR lr)
{
    lr.L = rol(lr.L, 1);
    lr.R = rol(lr.R, 1);

    des_bitswap_IP_FP(&lr.R, &lr.L,  1, 0x55555555);
    des_bitswap_IP_FP(&lr.L, &lr.R,  8, 0x00FF00FF);
    des_bitswap_IP_FP(&lr.L, &lr.R,  2, 0x33333333);
    des_bitswap_IP_FP(&lr.R, &lr.L, 16, 0x0000FFFF);
    des_bitswap_IP_FP(&lr.R, &lr.L,  4, 0x0F0F0F0F);

    return lr;
}